

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenuconnection.cpp
# Opt level: O0

bool __thiscall QDBusMenuConnection::registerTrayIcon(QDBusMenuConnection *this,QDBusTrayIcon *item)

{
  byte bVar1;
  byte bVar2;
  QDBusPlatformMenu *pQVar3;
  QDBusTrayIcon *in_RSI;
  QDBusTrayIcon *in_RDI;
  long in_FS_OFFSET;
  bool success;
  undefined4 in_stack_ffffffffffffff68;
  RegisterOption in_stack_ffffffffffffff6c;
  QFlags<QDBusConnection::RegisterOption> *in_stack_ffffffffffffff70;
  int line;
  QDBusTrayIcon *item_00;
  undefined6 in_stack_ffffffffffffff88;
  bool local_59;
  QDBusTrayIcon *in_stack_ffffffffffffffb8;
  QDBusMenuConnection *in_stack_ffffffffffffffc0;
  QDebug local_20 [2];
  QDBusConnection local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  connection((QDBusMenuConnection *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  item_00 = in_RSI;
  QFlags<QDBusConnection::RegisterOption>::QFlags
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  line = (int)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  bVar1 = QDBusConnection::registerObject
                    ((QString *)local_10,(QObject *)&StatusNotifierItemPath,
                     (QFlags_conflict *)item_00);
  QDBusConnection::~QDBusConnection(local_10);
  bVar2 = bVar1 & 1;
  if (bVar2 == 0) {
    unregisterTrayIcon((QDBusMenuConnection *)item_00,in_RDI);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)item_00,(char *)in_RDI,line,
               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    QMessageLogger::warning();
    QDebug::operator<<((QDebug *)CONCAT17(bVar2,CONCAT16(bVar1,in_stack_ffffffffffffff88)),
                       (char *)in_stack_ffffffffffffffb8);
    QDBusTrayIcon::instanceId
              ((QDBusTrayIcon *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    QDebug::operator<<((QDebug *)item_00,(QString *)in_RDI);
    QDebug::operator<<((QDebug *)item_00,(QString *)in_RDI);
    QString::~QString((QString *)0xaf2aad);
    QDebug::~QDebug(local_20);
    local_59 = false;
  }
  else {
    pQVar3 = QDBusTrayIcon::menu((QDBusTrayIcon *)in_RSI);
    if (pQVar3 != (QDBusPlatformMenu *)0x0) {
      registerTrayIconMenu
                ((QDBusMenuConnection *)CONCAT17(bVar2,CONCAT16(bVar1,in_stack_ffffffffffffff88)),
                 item_00);
    }
    local_59 = registerTrayIconWithWatcher(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_59;
  }
  __stack_chk_fail();
}

Assistant:

bool QDBusMenuConnection::registerTrayIcon(QDBusTrayIcon *item)
{
    bool success = connection().registerObject(StatusNotifierItemPath, item);
    if (!success) {
        unregisterTrayIcon(item);
        qWarning() << "failed to register" << item->instanceId() << StatusNotifierItemPath;
        return false;
    }

    if (item->menu())
        registerTrayIconMenu(item);

    return registerTrayIconWithWatcher(item);
}